

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr_ipp.hpp
# Opt level: O1

shared_ptr<duckdb::Pipeline,_true> __thiscall
duckdb::weak_ptr<duckdb::Pipeline,_true>::lock(weak_ptr<duckdb::Pipeline,_true> *this)

{
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 *in_RSI;
  bool bVar4;
  shared_ptr<duckdb::Pipeline,_true> sVar5;
  shared_ptr<duckdb::Pipeline> local_20;
  
  local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count;
    do {
      if (iVar2 == 0) {
        local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count == 0;
  }
  if (bVar4) {
    local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*in_RSI;
  }
  shared_ptr<duckdb::Pipeline,_true>::shared_ptr
            ((shared_ptr<duckdb::Pipeline,_true> *)this,&local_20);
  _Var3._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Pipeline,_true>)
         sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T, SAFE> lock() const { // NOLINT: invalid case style
		return shared_ptr<T, SAFE>(internal.lock());
	}